

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflatePrime(z_streamp strm,int bits,int value)

{
  deflate_state *s;
  int iVar1;
  int iVar2;
  
  iVar2 = deflateStateCheck(strm);
  if (iVar2 == 0) {
    s = strm->state;
    if (s->d_buf < s->pending_out + 2) {
      iVar2 = -5;
    }
    else {
      do {
        iVar2 = s->bi_valid;
        iVar1 = 0x10 - iVar2;
        if (bits <= 0x10 - iVar2) {
          iVar1 = bits;
        }
        s->bi_buf = s->bi_buf |
                    (ushort)((~(-1 << ((byte)iVar1 & 0x1f)) & value) << ((byte)iVar2 & 0x1f));
        s->bi_valid = iVar2 + iVar1;
        _tr_flush_bits(s);
        value = value >> ((byte)iVar1 & 0x1f);
        bits = bits - iVar1;
      } while (bits != 0);
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int ZEXPORT deflatePrime (strm, bits, value)
    z_streamp strm;
    int bits;
    int value;
{
    deflate_state *s;
    int put;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;
    if ((Bytef *)(s->d_buf) < s->pending_out + ((Buf_size + 7) >> 3))
        return Z_BUF_ERROR;
    do {
        put = Buf_size - s->bi_valid;
        if (put > bits)
            put = bits;
        s->bi_buf |= (ush)((value & ((1 << put) - 1)) << s->bi_valid);
        s->bi_valid += put;
        _tr_flush_bits(s);
        value >>= put;
        bits -= put;
    } while (bits);
    return Z_OK;
}